

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

bool IsKBI19Track(Track *track)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  vector<Sector,_std::allocator<Sector>_> *pvVar5;
  Sector *this;
  uint8_t *puVar6;
  Sector *s;
  
  iVar4 = Track::size(track);
  if ((iVar4 == 0x14) || (iVar4 = Track::size(track), iVar4 == 0x13)) {
    pvVar5 = Track::sectors(track);
    pSVar1 = (pvVar5->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = "";
    pSVar2 = (pvVar5->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      this = pSVar2;
      if (this == pSVar1) {
        if (opt.debug != 0) {
          util::operator<<((LogHelper *)&util::cout,(char (*) [23])"detected KBI-19 track\n");
          return true;
        }
        return true;
      }
      if (this->datarate != _250K) {
        return false;
      }
      if (this->encoding != MFM) {
        return false;
      }
      if ((this->header).sector != (uint)*puVar6) {
        return false;
      }
      iVar4 = Sector::size(this);
      if (iVar4 != 0x200) {
        return false;
      }
      bVar3 = Sector::has_good_data(this);
      puVar6 = puVar6 + 1;
      pSVar2 = this + 1;
    } while ((bVar3) || ((this->header).sector == 0x13));
  }
  return false;
}

Assistant:

bool IsKBI19Track(const Track& track)
{
    static const uint8_t ids[]{ 0,1,4,7,10,13,16,2,5,8,11,14,17,3,6,9,12,15,18,19 };

    // CPC version has 19 sectors, PC version has 20 (with bad sector 19).
    if (track.size() != arraysize(ids) && track.size() != arraysize(ids) - 1)
        return false;

    int idx = 0;
    for (auto& s : track.sectors())
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.sector != ids[idx++] || s.size() != 512 ||
            (!s.has_good_data() && s.header.sector != 19))
            return false;
    }

    if (opt.debug) util::cout << "detected KBI-19 track\n";
    return true;
}